

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::commandProcessFinished
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle,
          ProcessResult *commandResult)

{
  llb_buildsystem_command_result_t commandResult_00;
  llb_buildsystem_command_extended_result_t local_50;
  
  if ((this->cAPIDelegate).command_process_finished !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_buildsystem_command_extended_result_t_ptr
       *)0x0) {
    commandResult_00 = commandResult->status;
    get_command_result(commandResult_00);
    local_50.exit_status = commandResult->exitCode;
    local_50.pid = commandResult->pid;
    local_50.utime = commandResult->utime;
    local_50.stime = commandResult->stime;
    local_50.maxrss = commandResult->maxrss;
    local_50.result = commandResult_00;
    (*(this->cAPIDelegate).command_process_finished)
              ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,
               (llb_buildsystem_process_t *)handle.id,&local_50);
  }
  return;
}

Assistant:

virtual void commandProcessFinished(Command* command, ProcessHandle handle,
                                      const ProcessResult& commandResult) override {
    if (cAPIDelegate.command_process_finished) {
      llb_buildsystem_command_extended_result_t result;
      result.result = get_command_result(commandResult.status);
      result.exit_status = commandResult.exitCode;
      result.pid = commandResult.pid;
      result.utime = commandResult.utime;
      result.stime = commandResult.stime;
      result.maxrss = commandResult.maxrss;

      cAPIDelegate.command_process_finished(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          (llb_buildsystem_process_t*) handle.id,
          &result);
    }
  }